

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O0

void Security::InsertRandomFunctionPad(Instr *instrBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Func *pFVar3;
  UINT_PTR UVar4;
  undefined4 *puVar5;
  uint local_14;
  DWORD randomPad;
  Instr *instrBeforeInstr_local;
  
  pFVar3 = Func::GetTopFunc(instrBeforeInstr->m_func);
  sourceContextId = Func::GetSourceContextId(pFVar3);
  pFVar3 = Func::GetTopFunc(instrBeforeInstr->m_func);
  functionId = Func::GetLocalFunctionId(pFVar3);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,InsertNOPsPhase,sourceContextId,functionId);
  if (((!bVar2) &&
      (bVar2 = Js::ConfigFlagsTable::IsEnabled
                         ((ConfigFlagsTable *)&Js::Configuration::Global,DebugFlag), !bVar2)) &&
     (bVar2 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BenchmarkFlag), !bVar2)) {
    UVar4 = Math::Rand();
    local_14 = (uint)UVar4 & 0xf;
    if (local_14 == 1) {
      InsertSmallNOP(instrBeforeInstr,1);
    }
    else {
      if ((UVar4 & 1) != 0) {
        InsertSmallNOP(instrBeforeInstr,3);
        local_14 = local_14 - 3;
      }
      if ((local_14 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                           ,0x94,"((randomPad & 1) == 0)","(randomPad & 1) == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      for (; 3 < local_14; local_14 = local_14 - 4) {
        InsertSmallNOP(instrBeforeInstr,4);
      }
      if ((local_14 != 2) && (local_14 != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                           ,0x9a,"(randomPad == 2 || randomPad == 0)",
                           "randomPad == 2 || randomPad == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (local_14 == 2) {
        InsertSmallNOP(instrBeforeInstr,2);
      }
    }
  }
  return;
}

Assistant:

void
Security::InsertRandomFunctionPad(IR::Instr * instrBeforeInstr)
{
    if (PHASE_OFF(Js::InsertNOPsPhase, instrBeforeInstr->m_func->GetTopFunc())
        || CONFIG_ISENABLED(Js::DebugFlag) || CONFIG_ISENABLED(Js::BenchmarkFlag))
    {
        return;
    }
    DWORD randomPad = Math::Rand() & ((0 - INSTR_ALIGNMENT) & 0xF);
#ifndef _M_ARM
    if (randomPad == 1)
    {
        InsertSmallNOP(instrBeforeInstr, 1);
        return;
    }
    if (randomPad & 1)
    {
        InsertSmallNOP(instrBeforeInstr, 3);
        randomPad -= 3;
    }
#endif
    Assert((randomPad & 1) == 0);
    while (randomPad >= 4)
    {
        InsertSmallNOP(instrBeforeInstr, 4);
        randomPad -= 4;
    }
    Assert(randomPad == 2 || randomPad == 0);
    if (randomPad == 2)
    {
        InsertSmallNOP(instrBeforeInstr, 2);
    }
}